

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O2

MethodHandle * __thiscall
jsonrpccxx::methodHandle<unsigned_int,unsigned_int,unsigned_int>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          function<unsigned_int_(unsigned_int,_unsigned_int)> *method)

{
  function<unsigned_int_(unsigned_int,_unsigned_int)> local_30;
  
  std::function<unsigned_int_(unsigned_int,_unsigned_int)>::function
            (&local_30,(function<unsigned_int_(unsigned_int,_unsigned_int)> *)this);
  createMethodHandle<unsigned_int,unsigned_int,unsigned_int,0ul,1ul>
            (__return_storage_ptr__,(jsonrpccxx *)&local_30);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle methodHandle(std::function<ReturnType(ParamTypes...)> method) {
    return createMethodHandle(method, std::index_sequence_for<ParamTypes...>{});
  }